

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

bool __thiscall cmTargetInternals::IsImported(cmTargetInternals *this)

{
  Visibility VVar1;
  cmTargetInternals *this_local;
  
  VVar1 = this->TargetVisibility;
  if (VVar1 < Imported) {
    this_local._7_1_ = false;
  }
  else {
    if (VVar1 != Imported && VVar1 != ImportedGlobally) {
      __assert_fail("false && \"unknown visibility (IsImported)\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmTarget.cxx"
                    ,0xb5c,"bool cmTargetInternals::IsImported() const");
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmTargetInternals::IsImported() const
{
  switch (this->TargetVisibility) {
    case cmTarget::Visibility::Imported:
    case cmTarget::Visibility::ImportedGlobally:
      return true;
    case cmTarget::Visibility::Normal:
    case cmTarget::Visibility::Generated:
      return false;
  }
  assert(false && "unknown visibility (IsImported)");
  return false;
}